

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

mraa_result_t mraa_uart_flush(mraa_uart_context dev)

{
  int iVar1;
  mraa_uart_context dev_local;
  
  if (dev == (mraa_uart_context)0x0) {
    syslog(3,"uart: flush: context is NULL");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (((dev == (mraa_uart_context)0x0) || (dev->advance_func == (mraa_adv_func_t *)0x0)) ||
          (dev->advance_func->uart_flush_replace == (_func_mraa_result_t_mraa_uart_context *)0x0)) {
    iVar1 = tcdrain(dev->fd);
    if (iVar1 == -1) {
      dev_local._4_4_ = MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
    else {
      dev_local._4_4_ = MRAA_SUCCESS;
    }
  }
  else {
    dev_local._4_4_ = (*dev->advance_func->uart_flush_replace)(dev);
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_uart_flush(mraa_uart_context dev)
{
    if (!dev) {
        syslog(LOG_ERR, "uart: flush: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, uart_flush_replace)) {
        return dev->advance_func->uart_flush_replace(dev);
    }

#if !defined(PERIPHERALMAN)
    if (tcdrain(dev->fd) == -1) {
        return MRAA_ERROR_FEATURE_NOT_SUPPORTED;
    }
#endif

    return MRAA_SUCCESS;
}